

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int client_collected_extensions
              (ptls_t *tls,ptls_handshake_properties_t *properties,ptls_raw_extension_t *slots)

{
  ptls_iovec_t vec;
  ptls_iovec_t vec_00;
  ptls_iovec_t vec_01;
  int iVar1;
  int iVar2;
  quicly_conn_t *conn_00;
  size_t sVar3;
  short *in_RDX;
  long in_RSI;
  quicly_remote_cid_t *remote_cid;
  quicly_cid_t retry_scid;
  quicly_cid_t initial_scid;
  quicly_cid_t original_dcid;
  quicly_transport_parameters_t params;
  uint8_t *end;
  uint8_t *src;
  int ret;
  quicly_conn_t *conn;
  undefined4 in_stack_fffffffffffffe74;
  uint8_t *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  undefined1 local_df [20];
  byte local_cb;
  undefined1 local_ca [2];
  uint8_t *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4a;
  undefined5 in_stack_ffffffffffffff4b;
  quicly_cid_t *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  quicly_transport_parameters_t *in_stack_ffffffffffffff60;
  ulong local_98;
  uint8_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined4 uStack_84;
  ulong local_78;
  ulong local_70;
  int local_24;
  
  conn_00 = (quicly_conn_t *)(in_RSI + -0x8b8);
  if (*(int *)(in_RSI + 0x28) == 0) {
    __assert_fail("properties->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x841,
                  "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                 );
  }
  if (*in_RDX == -1) {
    local_24 = 0x6d;
  }
  else {
    if (*in_RDX != -0x5b) {
      __assert_fail("slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x847,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    if (in_RDX[0xc] != -1) {
      __assert_fail("slots[1].type == UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x848,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    memset(local_df,0,0x15);
    if (*(long *)(in_RSI + -0x748) != 0) {
      __assert_fail("remote_cid->sequence == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x851,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    iVar1 = needs_cid_auth(conn_00);
    if (iVar1 == 0) {
      is_retry(conn_00);
    }
    needs_cid_auth(conn_00);
    iVar1 = needs_cid_auth(conn_00);
    if (iVar1 != 0) {
      is_retry(conn_00);
    }
    iVar1 = recognize_delayed_ack(conn_00);
    local_24 = quicly_decode_transport_parameter_list
                         (in_stack_ffffffffffffff60,
                          (quicly_cid_t *)
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff50,
                          (quicly_cid_t *)
                          CONCAT53(in_stack_ffffffffffffff4b,
                                   CONCAT12(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48)),
                          in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    if (local_24 == 0) {
      iVar2 = needs_cid_auth(conn_00);
      if ((iVar2 != 0) || (iVar2 = is_retry(conn_00), iVar2 != 0)) {
        ptls_iovec_init(&stack0xffffffffffffff4b,(ulong)in_stack_ffffffffffffff5f);
        vec.len = in_stack_fffffffffffffe80;
        vec.base = in_stack_fffffffffffffe78;
        iVar2 = quicly_cid_is_equal((quicly_cid_t *)CONCAT44(in_stack_fffffffffffffe74,iVar1),vec);
        if (iVar2 == 0) {
          return 0x20008;
        }
      }
      iVar2 = needs_cid_auth(conn_00);
      if (iVar2 != 0) {
        ptls_iovec_init(local_ca,(ulong)in_stack_ffffffffffffff4a);
        vec_00.len = in_stack_fffffffffffffe80;
        vec_00.base = in_stack_fffffffffffffe78;
        iVar2 = quicly_cid_is_equal((quicly_cid_t *)CONCAT44(in_stack_fffffffffffffe74,iVar1),vec_00
                                   );
        if (iVar2 == 0) {
          return 0x20008;
        }
        iVar2 = is_retry(conn_00);
        if (iVar2 != 0) {
          sVar3 = in_RSI + 0xe0;
          ptls_iovec_init(local_df,(ulong)local_cb);
          vec_01.len = sVar3;
          vec_01.base = in_stack_fffffffffffffe78;
          iVar2 = quicly_cid_is_equal((quicly_cid_t *)CONCAT44(in_stack_fffffffffffffe74,iVar1),
                                      vec_01);
          if (iVar2 == 0) {
            return 0x20008;
          }
        }
      }
      if (*(int *)(in_RSI + 0x28) == 2) {
        if (CONCAT44(uStack_84,in_stack_ffffffffffffff78) < *(ulong *)(in_RSI + -0x610)) {
          return 0x20008;
        }
        if (in_stack_ffffffffffffff60 < *(quicly_transport_parameters_t **)(in_RSI + -0x628)) {
          return 0x20008;
        }
        if (local_98 < *(ulong *)(in_RSI + -0x620)) {
          return 0x20008;
        }
        if (in_stack_ffffffffffffff70 < *(uint8_t **)(in_RSI + -0x618)) {
          return 0x20008;
        }
        if (local_78 < *(ulong *)(in_RSI + -0x600)) {
          return 0x20008;
        }
        if (local_70 < *(ulong *)(in_RSI + -0x5f8)) {
          return 0x20008;
        }
      }
      memcpy((void *)(in_RSI + -0x628),&stack0xffffffffffffff60,0x68);
      ack_frequency_set_next_update_at((quicly_conn_t *)CONCAT44(in_stack_fffffffffffffe74,iVar1));
    }
  }
  return local_24;
}

Assistant:

static int client_collected_extensions(ptls_t *tls, ptls_handshake_properties_t *properties, ptls_raw_extension_t *slots)
{
    quicly_conn_t *conn = (void *)((char *)properties - offsetof(quicly_conn_t, crypto.handshake_properties));
    int ret;

    assert(properties->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);

    if (slots[0].type == UINT16_MAX) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }
    assert(slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS);
    assert(slots[1].type == UINT16_MAX);

    const uint8_t *src = slots[0].data.base, *end = src + slots[0].data.len;
    quicly_transport_parameters_t params;
    quicly_cid_t original_dcid, initial_scid, retry_scid = {};

    /* obtain pointer to initial CID of the peer. It is guaranteeed to exist in the first slot, as TP is received before any frame
     * that updates the CID set. */
    quicly_remote_cid_t *remote_cid = &conn->super.remote.cid_set.cids[0];
    assert(remote_cid->sequence == 0);

    /* decode */
    if ((ret = quicly_decode_transport_parameter_list(&params, needs_cid_auth(conn) || is_retry(conn) ? &original_dcid : NULL,
                                                      needs_cid_auth(conn) ? &initial_scid : &tp_cid_ignore,
                                                      needs_cid_auth(conn) ? is_retry(conn) ? &retry_scid : NULL : &tp_cid_ignore,
                                                      remote_cid->stateless_reset_token, src, end, recognize_delayed_ack(conn))) !=
        0)
        goto Exit;

    /* validate CIDs */
    if (needs_cid_auth(conn) || is_retry(conn)) {
        if (!quicly_cid_is_equal(&conn->super.original_dcid, ptls_iovec_init(original_dcid.cid, original_dcid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
    }
    if (needs_cid_auth(conn)) {
        if (!quicly_cid_is_equal(&remote_cid->cid, ptls_iovec_init(initial_scid.cid, initial_scid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
        if (is_retry(conn)) {
            if (!quicly_cid_is_equal(&conn->retry_scid, ptls_iovec_init(retry_scid.cid, retry_scid.len))) {
                ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                goto Exit;
            }
        }
    }

    if (properties->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED) {
#define ZERORTT_VALIDATE(x)                                                                                                        \
    if (params.x < conn->super.remote.transport_params.x) {                                                                        \
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                          \
        goto Exit;                                                                                                                 \
    }
        ZERORTT_VALIDATE(max_data);
        ZERORTT_VALIDATE(max_stream_data.bidi_local);
        ZERORTT_VALIDATE(max_stream_data.bidi_remote);
        ZERORTT_VALIDATE(max_stream_data.uni);
        ZERORTT_VALIDATE(max_streams_bidi);
        ZERORTT_VALIDATE(max_streams_uni);
#undef ZERORTT_VALIDATE
    }

    /* store the results */
    conn->super.remote.transport_params = params;
    ack_frequency_set_next_update_at(conn);

Exit:
    return ret; /* negative error codes used to transmit QUIC errors through picotls */
}